

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::create_octaves(Sift *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  float fVar2;
  int *piVar3;
  size_type sVar4;
  reference this_00;
  reference __r;
  shared_ptr<const_core::Image<float>_> local_d8;
  shared_ptr<core::Image<float>_> local_c8;
  undefined1 local_b8 [8];
  ConstPtr pre_base;
  int local_94;
  int local_90;
  float local_8c;
  int i_1;
  float img_sigma;
  shared_ptr<core::Image<float>_> local_78;
  int local_64;
  undefined1 local_60 [4];
  int i;
  ConstPtr img;
  shared_ptr<const_core::Image<float>_> local_30;
  undefined1 local_20 [8];
  Ptr img_1;
  Sift *this_local;
  
  img_1.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::clear
            (&this->octaves);
  if ((this->options).min_octave < 0) {
    std::shared_ptr<const_core::Image<float>_>::shared_ptr(&local_30,&this->orig);
    core::image::rescale_double_size_supersample<float>((image *)local_20,&local_30);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_30);
    p_Var1 = &img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)p_Var1,
               (shared_ptr<core::Image<float>_> *)local_20);
    fVar2 = (this->options).inherent_blur_sigma;
    add_octave(this,(ConstPtr *)p_Var1,fVar2 + fVar2,(this->options).base_blur_sigma);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)
               &img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_20);
  }
  std::shared_ptr<const_core::Image<float>_>::shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)local_60,&this->orig);
  for (local_64 = 0; local_64 < (this->options).min_octave; local_64 = local_64 + 1) {
    std::shared_ptr<const_core::Image<float>_>::shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)&i_1,
               (shared_ptr<const_core::Image<float>_> *)local_60);
    core::image::rescale_half_size_gaussian<float>
              ((image *)&local_78,(shared_ptr<const_core::Image<float>_> *)&i_1,0.8660254);
    std::shared_ptr<core::Image<float>const>::operator=
              ((shared_ptr<core::Image<float>const> *)local_60,&local_78);
    std::shared_ptr<core::Image<float>_>::~shared_ptr(&local_78);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)&i_1);
  }
  local_8c = (this->options).inherent_blur_sigma;
  local_94 = 0;
  piVar3 = std::max<int>(&local_94,&(this->options).min_octave);
  for (local_90 = *piVar3; local_90 <= (this->options).max_octave; local_90 = local_90 + 1) {
    p_Var1 = &pre_base.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<const_core::Image<float>_>::shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)p_Var1,
               (shared_ptr<const_core::Image<float>_> *)local_60);
    add_octave(this,(ConstPtr *)p_Var1,local_8c,(this->options).base_blur_sigma);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)
               &pre_base.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar4 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::size
                      (&this->octaves);
    this_00 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
              operator[](&this->octaves,sVar4 - 1);
    __r = std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::operator[](&this_00->img,0);
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)local_b8,__r);
    std::shared_ptr<const_core::Image<float>_>::shared_ptr
              (&local_d8,(shared_ptr<const_core::Image<float>_> *)local_b8);
    core::image::rescale_half_size_gaussian<float>((image *)&local_c8,&local_d8,0.8660254);
    std::shared_ptr<core::Image<float>const>::operator=
              ((shared_ptr<core::Image<float>const> *)local_60,&local_c8);
    std::shared_ptr<core::Image<float>_>::~shared_ptr(&local_c8);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_d8);
    local_8c = (this->options).base_blur_sigma;
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)local_b8);
  }
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr
            ((shared_ptr<const_core::Image<float>_> *)local_60);
  return;
}

Assistant:

void
Sift::create_octaves (void)
{
    this->octaves.clear();

    /*
     * Create octave -1. The original image is assumed to have blur
     * sigma = 0.5. The double size image therefore has sigma = 1.
     */
    if (this->options.min_octave < 0)
    {
        //std::cout << "Creating octave -1..." << std::endl;
        core::FloatImage::Ptr img
            = core::image::rescale_double_size_supersample<float>(this->orig);
        this->add_octave(img, this->options.inherent_blur_sigma * 2.0f,
            this->options.base_blur_sigma);
    }

    /*
     * Prepare image for the first positive octave by downsampling.
     * This code is executed only if min_octave > 0.
     */
    core::FloatImage::ConstPtr img = this->orig;
    for (int i = 0; i < this->options.min_octave; ++i)
        img = core::image::rescale_half_size_gaussian<float>(img);

    /*
     * Create new octave from 'img', then subsample octave image where
     * sigma is doubled to get a new base image for the next octave.
     */
    float img_sigma = this->options.inherent_blur_sigma;
    for (int i = std::max(0, this->options.min_octave);
        i <= this->options.max_octave; ++i)
    {
        //std::cout << "Creating octave " << i << "..." << std::endl;
        this->add_octave(img, img_sigma, this->options.base_blur_sigma);

        core::FloatImage::ConstPtr pre_base = octaves[octaves.size()-1].img[0];
        img = core::image::rescale_half_size_gaussian<float>(pre_base);

        img_sigma = this->options.base_blur_sigma;
    }
}